

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall
inja::RenderError::RenderError(RenderError *this,string *message,SourceLocation location)

{
  allocator<char> local_49;
  string local_48;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"render_error",&local_49)
  ;
  InjaError::InjaError(&this->super_InjaError,&local_48,message,location);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&this->super_InjaError = &PTR__InjaError_0019c498;
  return;
}

Assistant:

explicit RenderError(const std::string& message, SourceLocation location): InjaError("render_error", message, location) {}